

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O2

void cinemo::threading::doSingleThreadedConversion
               (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,
               Options *options)

{
  pointer ppLVar1;
  ostream *poVar2;
  char *ctx;
  pointer ppLVar3;
  string local_50 [32];
  
  ctx = "\nSingle-threaded conversion is in progress...";
  poVar2 = std::operator<<((ostream *)&std::cout,"\nSingle-threaded conversion is in progress...");
  std::endl<char,std::char_traits<char>>(poVar2);
  ppLVar1 = (lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar3 = (lw->
                 super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppLVar3 != ppLVar1; ppLVar3 = ppLVar3 + 1
      ) {
    LameWrapper::init(*ppLVar3,(EVP_PKEY_CTX *)ctx);
    poVar2 = std::operator<<((ostream *)&std::cout,"MainThread");
    poVar2 = std::operator<<(poVar2," => ");
    std::__cxx11::string::string(local_50,(string *)&(*ppLVar3)->file);
    ctx = (char *)local_50;
    poVar2 = std::operator<<(poVar2,local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_50);
    if (options->verbose == true) {
      LameWrapper::printWaveInfo(*ppLVar3);
    }
    LameWrapper::convertToMp3(*ppLVar3);
  }
  return;
}

Assistant:

void doSingleThreadedConversion(const vector<LameWrapper*>& lw,
                                        const args::Options& options) {
            cout << "\nSingle-threaded conversion is in progress..." << endl;

            for (auto& work : lw) {
				work->init();
				cout << "MainThread" << " => " << work->getFileName()
					<< endl;
                if (options.verbose) {
                    work->printWaveInfo();
                }
                work->convertToMp3();
            }
        }